

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_process_function
          (t_php_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  int *piVar1;
  t_struct *ptVar2;
  t_struct *ptVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  t_type *ptVar9;
  undefined4 extraout_var;
  size_type *psVar10;
  pointer pptVar11;
  string resultname;
  string argsname;
  string local_160;
  t_function *local_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  t_struct *local_58;
  string local_50;
  
  local_140 = tfunction;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"protected function process_",0x1b);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(local_140->name_)._M_dataplus._M_p,(local_140->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"($seqid, $input, $output)",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  php_namespace_abi_cxx11_(&local_118,this,(tservice->super_t_type).program_);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_118,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_138.field_2._M_allocated_capacity = *psVar10;
    local_138.field_2._8_8_ = plVar8[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar10;
    local_138._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar8[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_160._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_160,(ulong)(local_140->name_)._M_dataplus._M_p);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_d8.field_2._M_allocated_capacity = *psVar10;
    local_d8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar10;
    local_d8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_b8.field_2._M_allocated_capacity = *psVar10;
    local_b8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar10;
    local_b8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  php_namespace_abi_cxx11_(&local_f8,this,(tservice->super_t_type).program_);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118.field_2._8_8_ = plVar8[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_118._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_138.field_2._M_allocated_capacity = *psVar10;
    local_138.field_2._8_8_ = plVar8[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar10;
    local_138._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)(local_140->name_)._M_dataplus._M_p);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160.field_2._8_8_ = plVar8[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar10;
    local_160._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_160._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_d8.field_2._M_allocated_capacity = *psVar10;
    local_d8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar10;
    local_d8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$bin_accel = ($input instanceof ",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_read_binary_after_message_begin\');"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if ($bin_accel) {",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"$args = thrift_protocol_read_binary_after_message_begin(",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$input,",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\',",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$input->isStrictRead()",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} else {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$args = new ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$args->read($input);",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (this->binary_inline_ == false) {
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$input->readMessageEnd();",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
  }
  ptVar2 = local_140->xceptions_;
  if (local_140->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$result = new ",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_d8._M_dataplus._M_p,local_d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"();",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
  }
  if ((ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"try {",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
  }
  ptVar3 = local_140->arglist_;
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_160._M_dataplus._M_p,local_160._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_58 = ptVar2;
  if (local_140->oneway_ == false) {
    iVar6 = (*(local_140->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar6 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(out,"$result->success = ",0x13);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"$this->handler_->",0x11);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(local_140->name_)._M_dataplus._M_p,(local_140->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
  pptVar11 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar11 !=
      (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = true;
    do {
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"$args->",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,((*pptVar11)->name_)._M_dataplus._M_p,((*pptVar11)->name_)._M_string_length);
      pptVar11 = pptVar11 + 1;
      bVar4 = false;
    } while (pptVar11 !=
             (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar2 = local_58;
  bVar5 = local_140->oneway_;
  if (((bool)bVar5 == false) &&
     (pptVar11 = (local_58->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
     (local_58->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pptVar11)) {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    do {
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} catch (",9);
      ptVar9 = t_type::get_true_type((*pptVar11)->type_);
      php_namespace_abi_cxx11_(&local_138,this,ptVar9->program_);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
      iVar6 = (*((*pptVar11)->type_->super_t_doc)._vptr_t_doc[3])();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                          ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," $",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar11)->name_)._M_dataplus._M_p,
                          ((*pptVar11)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if (local_140->oneway_ == false) {
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_160._M_dataplus._M_p,local_160._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$result->",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,((*pptVar11)->name_)._M_dataplus._M_p,
                            ((*pptVar11)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = $",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,((*pptVar11)->name_)._M_dataplus._M_p,
                            ((*pptVar11)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_160._M_dataplus._M_p,local_160._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    bVar5 = local_140->oneway_;
  }
  if ((bVar5 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"$bin_accel = ($output instanceof ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "TBinaryProtocolAccelerated) && function_exists(\'thrift_protocol_write_binary\');",
               0x4f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if ($bin_accel) {",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"thrift_protocol_write_binary(",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$output,",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_140->name_)._M_dataplus._M_p,
                        (local_140->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\',",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TMessageType::REPLY,",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$result,",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$seqid,",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$output->isStrictWrite()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} else {",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if (this->binary_inline_ == true) {
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"$buff = pack(\'N\', (0x80010000 | ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TMessageType::REPLY)); ",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"$buff .= pack(\'N\', strlen(\'",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(local_140->name_)._M_dataplus._M_p,
                          (local_140->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'));",4);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$buff .= \'",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(local_140->name_)._M_dataplus._M_p,
                          (local_140->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\';",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"$buff .= pack(\'N\', $seqid);",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$result->write($buff);",0x16);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_98._M_dataplus._M_p,local_98._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$output->write($buff);",0x16);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$output->flush();",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_160._M_dataplus._M_p,local_160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"$output->writeMessageBegin(\'",0x1c);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(local_140->name_)._M_dataplus._M_p,
                          (local_140->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\', ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"TMessageType::REPLY, $seqid);",0x1d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$result->write($output);",0x18);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_118._M_dataplus._M_p,local_118._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$output->writeMessageEnd();",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_f8._M_dataplus._M_p,local_f8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"$output->getTransport()->flush();",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return;",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_160._M_dataplus._M_p,local_160._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_php_generator::generate_process_function(std::ostream& out, t_service* tservice, t_function* tfunction) {
  // Open function
  out << indent() << "protected function process_" << tfunction->get_name() << "($seqid, $input, $output)" << endl
      << indent() << "{" << endl;
  indent_up();

  string argsname = php_namespace(tservice->get_program()) + service_name_ + "_"
                    + tfunction->get_name() + "_args";
  string resultname = php_namespace(tservice->get_program()) + service_name_ + "_"
                      + tfunction->get_name() + "_result";

  out << indent() << "$bin_accel = ($input instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_read_binary_after_message_begin');"
             << endl;
  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "$args = thrift_protocol_read_binary_after_message_begin(" <<endl;

  indent_up();
  out << indent() << "$input,"<<endl
      << indent() << "'" << argsname << "'," << endl
      << indent() << "$input->isStrictRead()" <<endl;

  indent_down();
  out << indent() <<");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;

  indent_up();
  out << indent() << "$args = new " << argsname << "();" << endl
      << indent() << "$args->read($input);" << endl;

  indent_down();
  out << indent() << "}" << endl;

  if (!binary_inline_) {
    out << indent() << "$input->readMessageEnd();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    out << indent() << "$result = new " << resultname << "();" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    out << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    out << "$result->success = ";
  }
  out << "$this->handler_->" << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      out << ", ";
    }
    out << "$args->" << (*f_iter)->get_name();
  }
  out << ");" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      out << indent() << "} catch ("
                 << php_namespace(get_true_type((*x_iter)->get_type())->get_program())
                 << (*x_iter)->get_type()->get_name() << " $" << (*x_iter)->get_name() << ") {"
                 << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        out << indent() << "$result->" << (*x_iter)->get_name() << " = $"
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        out << indent();
      }
    }
    out << "}" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    out << indent() << "return;" << endl;
    indent_down();
    out << indent() << "}" << endl;
    return;
  }

  out << indent() << "$bin_accel = ($output instanceof "
             << "TBinaryProtocolAccelerated) && function_exists('thrift_protocol_write_binary');"
             << endl;

  out << indent() << "if ($bin_accel) {" << endl;
  indent_up();

  out << indent() << "thrift_protocol_write_binary(" << endl;

  indent_up();
  out << indent() << "$output,"<<endl
      << indent() << "'" << tfunction->get_name()<< "'," <<endl
      << indent() << "TMessageType::REPLY,"<< endl
      << indent() << "$result," << endl
      << indent() << "$seqid," << endl
      << indent() << "$output->isStrictWrite()"<<endl;

  indent_down();
  out << indent() << ");" << endl;

  indent_down();
  out << indent() << "} else {" << endl;
  indent_up();

  // Serialize the request header
  if (binary_inline_) {
    out << indent() << "$buff = pack('N', (0x80010000 | "
        << "TMessageType::REPLY)); " << endl << indent() << "$buff .= pack('N', strlen('"
        << tfunction->get_name() << "'));" << endl << indent() << "$buff .= '"
        << tfunction->get_name() << "';" << endl << indent() << "$buff .= pack('N', $seqid);"
        << endl << indent() << "$result->write($buff);" << endl << indent()
        << "$output->write($buff);" << endl << indent() << "$output->flush();" << endl;
  } else {
    out << indent() << "$output->writeMessageBegin('" << tfunction->get_name() << "', "
        << "TMessageType::REPLY, $seqid);" << endl << indent() << "$result->write($output);"
        << endl << indent() << "$output->writeMessageEnd();" << endl << indent()
        << "$output->getTransport()->flush();" << endl;
  }

  scope_down(out);

  // Close function
  indent_down();
  out << indent() << "}" << endl;
}